

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O3

void Curl_llist_init(Curl_llist *l,Curl_llist_dtor dtor)

{
  l->_size = 0;
  l->_dtor = dtor;
  l->_head = (Curl_llist_node *)0x0;
  l->_tail = (Curl_llist_node *)0x0;
  return;
}

Assistant:

void
Curl_llist_init(struct Curl_llist *l, Curl_llist_dtor dtor)
{
  l->_size = 0;
  l->_dtor = dtor;
  l->_head = NULL;
  l->_tail = NULL;
#ifdef DEBUGBUILD
  l->_init = LLISTINIT;
#endif
}